

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clique.cc
# Opt level: O2

void __thiscall anon_unknown.dwarf_4ccef::CliqueRunner::~CliqueRunner(CliqueRunner *this)

{
  if (this->space != (int *)0x0) {
    operator_delete__(this->space);
  }
  gss::innards::Watches<int,_(anonymous_namespace)::FlatWatchTable>::~Watches(&this->watches);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->invorder).super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->order).super__Vector_base<int,_std::allocator<int>_>);
  std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::~vector
            (&this->connected_table);
  std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::~vector
            (&this->adj);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->incumbent).c.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

~CliqueRunner()
        {
            delete[] space;
        }